

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

SUNErrCode SUNMatScaleAdd_Sparse(sunrealtype c,SUNMatrix A,SUNMatrix B)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  void *__ptr;
  void *__ptr_00;
  SUNMatrix p_Var9;
  long *in_RSI;
  long *in_RDI;
  double in_XMM0_Qa;
  SUNContext sunctx_local_scope_;
  SUNMatrix C;
  sunrealtype *Cx;
  sunrealtype *Bx;
  sunrealtype *Ax;
  sunrealtype *x;
  sunindextype *Ci;
  sunindextype *Cp;
  sunindextype *Bi;
  sunindextype *Bp;
  sunindextype *Ai;
  sunindextype *Ap;
  sunindextype *w;
  int newmat;
  sunindextype cend;
  sunindextype N;
  sunindextype M;
  sunindextype newvals;
  sunindextype nz;
  sunindextype p;
  sunindextype i;
  sunindextype j;
  SUNContext sunctx;
  long lVar10;
  sunindextype in_stack_ffffffffffffff68;
  sunindextype in_stack_ffffffffffffff70;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  
  if (*(int *)(*in_RDI + 0x28) == 0) {
    local_48 = *(long *)*in_RDI;
    local_50 = *(long *)(*in_RDI + 8);
  }
  else {
    local_48 = *(long *)(*in_RDI + 8);
    local_50 = *(long *)*in_RDI;
  }
  lVar1 = *(long *)(*in_RDI + 0x38);
  lVar2 = *(long *)(*in_RDI + 0x30);
  lVar10 = *(long *)(*in_RDI + 0x20);
  lVar3 = *(long *)(*in_RSI + 0x38);
  lVar4 = *(long *)(*in_RSI + 0x30);
  sunctx = *(SUNContext *)(*in_RSI + 0x20);
  __ptr = malloc(local_48 << 3);
  __ptr_00 = malloc(local_48 << 3);
  local_40 = 0;
  for (local_20 = 0; local_20 < local_50; local_20 = local_20 + 1) {
    for (local_28 = 0; local_28 < local_48; local_28 = local_28 + 1) {
      *(undefined8 *)((long)__ptr + local_28 * 8) = 0;
    }
    for (local_28 = *(long *)(lVar1 + local_20 * 8); local_28 < *(long *)(lVar1 + 8 + local_20 * 8);
        local_28 = local_28 + 1) {
      lVar5 = *(long *)(lVar2 + local_28 * 8);
      *(long *)((long)__ptr + lVar5 * 8) = *(long *)((long)__ptr + lVar5 * 8) + 1;
    }
    for (local_28 = *(long *)(lVar3 + local_20 * 8); local_28 < *(long *)(lVar3 + 8 + local_20 * 8);
        local_28 = local_28 + 1) {
      lVar5 = *(long *)(lVar4 + local_28 * 8);
      *(long *)((long)__ptr + lVar5 * 8) = *(long *)((long)__ptr + lVar5 * 8) + -1;
    }
    for (local_28 = 0; local_28 < local_48; local_28 = local_28 + 1) {
      if (*(long *)((long)__ptr + local_28 * 8) < 0) {
        local_40 = local_40 + 1;
      }
    }
  }
  if (local_40 == 0) {
    for (local_20 = 0; local_20 < local_50; local_20 = local_20 + 1) {
      for (local_28 = 0; local_28 < local_48; local_28 = local_28 + 1) {
        *(undefined8 *)((long)__ptr_00 + local_28 * 8) = 0;
      }
      for (local_28 = *(long *)(lVar3 + local_20 * 8);
          local_28 < *(long *)(lVar3 + 8 + local_20 * 8); local_28 = local_28 + 1) {
        *(SUNProfiler *)((long)__ptr_00 + *(long *)(lVar4 + local_28 * 8) * 8) =
             (&sunctx->profiler)[local_28];
      }
      for (local_28 = *(long *)(lVar1 + local_20 * 8);
          local_28 < *(long *)(lVar1 + 8 + local_20 * 8); local_28 = local_28 + 1) {
        *(double *)(lVar10 + local_28 * 8) =
             in_XMM0_Qa * *(double *)(lVar10 + local_28 * 8) +
             *(double *)((long)__ptr_00 + *(long *)(lVar2 + local_28 * 8) * 8);
      }
    }
  }
  else if (*(long *)(*in_RDI + 0x10) - *(long *)(lVar1 + local_50 * 8) < local_40) {
    p_Var9 = SUNSparseMatrix(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                             (sunindextype)__ptr_00,(int)((ulong)lVar10 >> 0x20),sunctx);
    lVar5 = *(long *)((long)p_Var9->content + 0x38);
    lVar6 = *(long *)((long)p_Var9->content + 0x30);
    lVar7 = *(long *)((long)p_Var9->content + 0x20);
    local_38 = 0;
    for (local_20 = 0; local_20 < local_50; local_20 = local_20 + 1) {
      *(long *)(lVar5 + local_20 * 8) = local_38;
      for (local_28 = 0; local_28 < local_48; local_28 = local_28 + 1) {
        *(undefined8 *)((long)__ptr + local_28 * 8) = 0;
        *(undefined8 *)((long)__ptr_00 + local_28 * 8) = 0;
      }
      for (local_30 = *(long *)(lVar1 + local_20 * 8);
          local_30 < *(long *)(lVar1 + 8 + local_20 * 8); local_30 = local_30 + 1) {
        lVar8 = *(long *)(lVar2 + local_30 * 8);
        *(long *)((long)__ptr + lVar8 * 8) = *(long *)((long)__ptr + lVar8 * 8) + 1;
        *(double *)((long)__ptr_00 + *(long *)(lVar2 + local_30 * 8) * 8) =
             in_XMM0_Qa * *(double *)(lVar10 + local_30 * 8);
      }
      for (local_30 = *(long *)(lVar3 + local_20 * 8);
          local_30 < *(long *)(lVar3 + 8 + local_20 * 8); local_30 = local_30 + 1) {
        lVar8 = *(long *)(lVar4 + local_30 * 8);
        *(long *)((long)__ptr + lVar8 * 8) = *(long *)((long)__ptr + lVar8 * 8) + 1;
        lVar8 = *(long *)(lVar4 + local_30 * 8);
        *(double *)((long)__ptr_00 + lVar8 * 8) =
             (double)(&sunctx->profiler)[local_30] + *(double *)((long)__ptr_00 + lVar8 * 8);
      }
      for (local_28 = 0; local_28 < local_48; local_28 = local_28 + 1) {
        if (0 < *(long *)((long)__ptr + local_28 * 8)) {
          *(long *)(lVar6 + local_38 * 8) = local_28;
          *(undefined8 *)(lVar7 + local_38 * 8) = *(undefined8 *)((long)__ptr_00 + local_28 * 8);
          local_38 = local_38 + 1;
        }
      }
    }
    *(long *)(lVar5 + local_50 * 8) = local_38;
    *(undefined8 *)(*in_RDI + 0x10) = *(undefined8 *)((long)p_Var9->content + 0x10);
    free(*(void **)(*in_RDI + 0x20));
    *(undefined8 *)(*in_RDI + 0x20) = *(undefined8 *)((long)p_Var9->content + 0x20);
    *(undefined8 *)((long)p_Var9->content + 0x20) = 0;
    free(*(void **)(*in_RDI + 0x30));
    *(undefined8 *)(*in_RDI + 0x30) = *(undefined8 *)((long)p_Var9->content + 0x30);
    *(undefined8 *)((long)p_Var9->content + 0x30) = 0;
    free(*(void **)(*in_RDI + 0x38));
    *(undefined8 *)(*in_RDI + 0x38) = *(undefined8 *)((long)p_Var9->content + 0x38);
    *(undefined8 *)((long)p_Var9->content + 0x38) = 0;
    SUNMatDestroy_Sparse((SUNMatrix)0x14d47a);
  }
  else {
    local_38 = *(long *)(lVar1 + local_50 * 8) + local_40;
    local_58 = *(long *)(lVar1 + local_50 * 8);
    *(long *)(lVar1 + local_50 * 8) = local_38;
    while (local_20 = local_50 + -1, -1 < local_20) {
      for (local_28 = 0; local_28 < local_48; local_28 = local_28 + 1) {
        *(undefined8 *)((long)__ptr + local_28 * 8) = 0;
        *(undefined8 *)((long)__ptr_00 + local_28 * 8) = 0;
      }
      for (local_30 = *(long *)(lVar1 + local_20 * 8); local_30 < local_58; local_30 = local_30 + 1)
      {
        lVar5 = *(long *)(lVar2 + local_30 * 8);
        *(long *)((long)__ptr + lVar5 * 8) = *(long *)((long)__ptr + lVar5 * 8) + 1;
        *(double *)((long)__ptr_00 + *(long *)(lVar2 + local_30 * 8) * 8) =
             in_XMM0_Qa * *(double *)(lVar10 + local_30 * 8);
      }
      for (local_30 = *(long *)(lVar3 + local_20 * 8); local_28 = local_48,
          local_30 < *(long *)(lVar3 + 8 + local_20 * 8); local_30 = local_30 + 1) {
        lVar5 = *(long *)(lVar4 + local_30 * 8);
        *(long *)((long)__ptr + lVar5 * 8) = *(long *)((long)__ptr + lVar5 * 8) + 1;
        lVar5 = *(long *)(lVar4 + local_30 * 8);
        *(double *)((long)__ptr_00 + lVar5 * 8) =
             (double)(&sunctx->profiler)[local_30] + *(double *)((long)__ptr_00 + lVar5 * 8);
      }
      while (local_28 = local_28 + -1, -1 < local_28) {
        if (0 < *(long *)((long)__ptr + local_28 * 8)) {
          *(long *)(lVar2 + -8 + local_38 * 8) = local_28;
          *(undefined8 *)(lVar10 + (local_38 + -1) * 8) =
               *(undefined8 *)((long)__ptr_00 + local_28 * 8);
          local_38 = local_38 + -1;
        }
      }
      local_58 = *(long *)(lVar1 + local_20 * 8);
      *(long *)(lVar1 + local_20 * 8) = local_38;
      local_50 = local_20;
    }
  }
  free(__ptr);
  free(__ptr_00);
  return 0;
}

Assistant:

SUNErrCode SUNMatScaleAdd_Sparse(sunrealtype c, SUNMatrix A, SUNMatrix B)
{
  sunindextype j, i, p, nz, newvals, M, N, cend;
  sunbooleantype newmat;
  sunindextype *w, *Ap, *Ai, *Bp, *Bi, *Cp, *Ci;
  sunrealtype *x, *Ax, *Bx, *Cx;
  SUNMatrix C;
  SUNFunctionBegin(A->sunctx);

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);
  SUNAssert(SUNMatGetID(B) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrices(A, B), SUN_ERR_ARG_DIMSMISMATCH);

  /* store shortcuts to matrix dimensions (M is inner dimension, N is outer) */
  if (SM_SPARSETYPE_S(A) == CSC_MAT)
  {
    M = SM_ROWS_S(A);
    N = SM_COLUMNS_S(A);
  }
  else
  {
    M = SM_COLUMNS_S(A);
    N = SM_ROWS_S(A);
  }

  /* access data arrays from A and B (return if failure) */
  Ap = Ai = Bp = Bi = NULL;
  Ax = Bx = NULL;
  Ap      = SM_INDEXPTRS_S(A);
  SUNAssert(Ap, SUN_ERR_ARG_CORRUPT);
  Ai = SM_INDEXVALS_S(A);
  SUNAssert(Ai, SUN_ERR_ARG_CORRUPT);
  Ax = SM_DATA_S(A);
  SUNAssert(Ax, SUN_ERR_ARG_CORRUPT);
  Bp = SM_INDEXPTRS_S(B);
  SUNAssert(Bp, SUN_ERR_ARG_CORRUPT);
  Bi = SM_INDEXVALS_S(B);
  SUNAssert(Bi, SUN_ERR_ARG_CORRUPT);
  Bx = SM_DATA_S(B);
  SUNAssert(Bx, SUN_ERR_ARG_CORRUPT);

  /* create work arrays for row indices and nonzero column values */
  w = (sunindextype*)malloc(M * sizeof(sunindextype));
  SUNAssert(w, SUN_ERR_MALLOC_FAIL);
  x = (sunrealtype*)malloc(M * sizeof(sunrealtype));
  SUNAssert(x, SUN_ERR_MALLOC_FAIL);

  /* determine if A already contains the sparsity pattern of B */
  newvals = 0;
  for (j = 0; j < N; j++)
  {
    /* clear work array */
    for (i = 0; i < M; i++) { w[i] = 0; }

    /* scan column of A, incrementing w by one */
    for (i = Ap[j]; i < Ap[j + 1]; i++) { w[Ai[i]] += 1; }

    /* scan column of B, decrementing w by one */
    for (i = Bp[j]; i < Bp[j + 1]; i++) { w[Bi[i]] -= 1; }

    /* if any entry of w is negative, A doesn't contain B's sparsity,
       so increment necessary storage counter */
    for (i = 0; i < M; i++)
    {
      if (w[i] < 0) { newvals += 1; }
    }
  }

  /* If extra nonzeros required, check whether A has sufficient storage space
     for new nonzero entries (so B can be inserted into existing storage) */
  newmat = SUNFALSE; /* no reallocation needed */
  if (newvals > (SM_NNZ_S(A) - Ap[N])) { newmat = SUNTRUE; }

  /* perform operation based on existing/necessary structure */

  /*   case 1: A already contains sparsity pattern of B */
  if (newvals == 0)
  {
    /* iterate through columns, adding matrices */
    for (j = 0; j < N; j++)
    {
      /* clear work array */
      for (i = 0; i < M; i++) { x[i] = ZERO; }

      /* scan column of B, updating work array */
      for (i = Bp[j]; i < Bp[j + 1]; i++) { x[Bi[i]] = Bx[i]; }

      /* scan column of A, updating array entries appropriately */
      for (i = Ap[j]; i < Ap[j + 1]; i++) { Ax[i] = c * Ax[i] + x[Ai[i]]; }
    }

    /*   case 2: A has sufficient storage, but does not already contain B's
     * sparsity */
  }
  else if (!newmat)
  {
    /* determine storage location where last column (row) should end */
    nz = Ap[N] + newvals;

    /* store pointer past last column (row) from original A,
       and store updated value in revised A */
    cend  = Ap[N];
    Ap[N] = nz;

    /* iterate through columns (rows) backwards */
    for (j = N - 1; j >= 0; j--)
    {
      /* clear out temporary arrays for this column (row) */
      for (i = 0; i < M; i++)
      {
        w[i] = 0;
        x[i] = SUN_RCONST(0.0);
      }

      /* iterate down column (row) of A, collecting nonzeros */
      for (p = Ap[j]; p < cend; p++)
      {
        w[Ai[p]] += 1;        /* indicate that row (column) is filled */
        x[Ai[p]] = c * Ax[p]; /* collect/scale value */
      }

      /* iterate down column of B, collecting nonzeros */
      for (p = Bp[j]; p < Bp[j + 1]; p++)
      {
        w[Bi[p]] += 1;     /* indicate that row is filled */
        x[Bi[p]] += Bx[p]; /* collect value */
      }

      /* fill entries of A with this column's (row's) data */
      for (i = M - 1; i >= 0; i--)
      {
        if (w[i] > 0)
        {
          Ai[--nz] = i;
          Ax[nz]   = x[i];
        }
      }

      /* store ptr past this col (row) from orig A, update value for new A */
      cend  = Ap[j];
      Ap[j] = nz;
    }

    /*   case 3: A must be reallocated with sufficient storage */
  }
  else
  {
    /* create new matrix for sum */
    C = SUNSparseMatrix(SM_ROWS_S(A), SM_COLUMNS_S(A), Ap[N] + newvals,
                        SM_SPARSETYPE_S(A), A->sunctx);
    SUNCheckLastErr();

    /* access data from CSR structures (return if failure) */
    Cp = NULL;
    Ci = NULL;
    Cx = NULL;
    Cp = SM_INDEXPTRS_S(C);
    SUNAssert(Cp, SUN_ERR_ARG_CORRUPT);
    Ci = SM_INDEXVALS_S(C);
    SUNAssert(Ci, SUN_ERR_ARG_CORRUPT);
    Cx = SM_DATA_S(C);
    SUNAssert(Cx, SUN_ERR_ARG_CORRUPT);

    /* initialize total nonzero count */
    nz = 0;

    /* iterate through columns (rows) */
    for (j = 0; j < N; j++)
    {
      /* set current column (row) pointer to current # nonzeros */
      Cp[j] = nz;

      /* clear out temporary arrays for this column (row) */
      for (i = 0; i < M; i++)
      {
        w[i] = 0;
        x[i] = SUN_RCONST(0.0);
      }

      /* iterate down column of A, collecting nonzeros */
      for (p = Ap[j]; p < Ap[j + 1]; p++)
      {
        w[Ai[p]] += 1;        /* indicate that row is filled */
        x[Ai[p]] = c * Ax[p]; /* collect/scale value */
      }

      /* iterate down column of B, collecting nonzeros */
      for (p = Bp[j]; p < Bp[j + 1]; p++)
      {
        w[Bi[p]] += 1;     /* indicate that row is filled */
        x[Bi[p]] += Bx[p]; /* collect value */
      }

      /* fill entries of C with this column's data */
      for (i = 0; i < M; i++)
      {
        if (w[i] > 0)
        {
          Ci[nz]   = i;
          Cx[nz++] = x[i];
        }
      }
    }

    /* indicate end of data */
    Cp[N] = nz;

    /* update A's structure with C's values; nullify C's pointers */
    SM_NNZ_S(A) = SM_NNZ_S(C);

    free(SM_DATA_S(A));
    SM_DATA_S(A) = SM_DATA_S(C);
    SM_DATA_S(C) = NULL;

    free(SM_INDEXVALS_S(A));
    SM_INDEXVALS_S(A) = SM_INDEXVALS_S(C);
    SM_INDEXVALS_S(C) = NULL;

    free(SM_INDEXPTRS_S(A));
    SM_INDEXPTRS_S(A) = SM_INDEXPTRS_S(C);
    SM_INDEXPTRS_S(C) = NULL;

    /* clean up */
    SUNMatDestroy_Sparse(C);
  }

  /* clean up */
  free(w);
  free(x);

  /* return success */
  return SUN_SUCCESS;
}